

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O2

void csp_sendto(uint8_t prio,uint16_t dest,uint8_t dport,uint8_t src_port,uint32_t opts,
               csp_packet_t *packet)

{
  uint8_t *puVar1;
  
  if (-1 < (short)opts) {
    (packet->id).flags = '\0';
  }
  if ((opts & 1) == 0) {
    if ((opts & 4) != 0) {
      puVar1 = &(packet->id).flags;
      *puVar1 = *puVar1 | 8;
    }
    if ((opts & 0x40) != 0) {
      puVar1 = &(packet->id).flags;
      *puVar1 = *puVar1 | 1;
    }
    (packet->id).dst = dest;
    (packet->id).dport = dport;
    (packet->id).sport = src_port;
    (packet->id).pri = prio;
    csp_send_direct((csp_id_t_conflict *)&packet->id,packet,(csp_iface_t *)0x0);
    return;
  }
  csp_dbg_errno = '\a';
  csp_buffer_free(packet);
  return;
}

Assistant:

void csp_sendto(uint8_t prio, uint16_t dest, uint8_t dport, uint8_t src_port, uint32_t opts, csp_packet_t * packet) {

	if (!(opts & CSP_O_SAME))
		packet->id.flags = 0;

	if (opts & CSP_O_RDP) {
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		csp_buffer_free(packet);
		return;
	}

	if (opts & CSP_O_HMAC) {
#if (CSP_USE_HMAC)
		packet->id.flags |= CSP_FHMAC;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		csp_buffer_free(packet);
		return;
#endif
	}

	if (opts & CSP_O_CRC32) {
		packet->id.flags |= CSP_FCRC32;
	}

	packet->id.dst = dest;
	packet->id.dport = dport;
	packet->id.sport = src_port;
	packet->id.pri = prio;

	csp_send_direct(&packet->id, packet, NULL);

}